

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

bool is_identifier(char *s,qsizetype len)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  
  if (len < 1) {
    return false;
  }
  pcVar1 = s + len;
  if (3 < (ulong)len) {
    lVar4 = ((ulong)len >> 2) + 1;
    pcVar3 = s + 3;
    do {
      pcVar6 = pcVar3;
      cVar2 = pcVar6[-3];
      iVar5 = (int)cVar2;
      if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_'))
         && (cVar2 != '$')) {
        pcVar6 = pcVar6 + -3;
        goto LAB_0013617a;
      }
      cVar2 = pcVar6[-2];
      iVar5 = (int)cVar2;
      if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_'))
         && (cVar2 != '$')) {
        pcVar6 = pcVar6 + -2;
        goto LAB_0013617a;
      }
      cVar2 = pcVar6[-1];
      iVar5 = (int)cVar2;
      if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_'))
         && (cVar2 != '$')) {
        pcVar6 = pcVar6 + -1;
        goto LAB_0013617a;
      }
      cVar2 = *pcVar6;
      iVar5 = (int)cVar2;
      if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_'))
         && (cVar2 != '$')) goto LAB_0013617a;
      lVar4 = lVar4 + -1;
      pcVar3 = pcVar6 + 4;
    } while (1 < lVar4);
    s = pcVar6 + 1;
  }
  lVar4 = (long)pcVar1 - (long)s;
  if (lVar4 != 1) {
    pcVar6 = s;
    if (lVar4 != 2) {
      pcVar6 = pcVar1;
      if (lVar4 != 3) goto LAB_0013617a;
      cVar2 = *s;
      iVar5 = (int)cVar2;
      if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_'))
         && (pcVar6 = s, cVar2 != '$')) goto LAB_0013617a;
      pcVar6 = s + 1;
    }
    cVar2 = *pcVar6;
    iVar5 = (int)cVar2;
    if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_')) &&
       (cVar2 != '$')) goto LAB_0013617a;
    s = pcVar6 + 1;
  }
  cVar2 = *s;
  iVar5 = (int)cVar2;
  pcVar6 = pcVar1;
  if (((0x19 < iVar5 - 0x41U && (0x19 < iVar5 - 0x61U && 9 < iVar5 - 0x30U)) && (cVar2 != '_')) &&
     (pcVar6 = s, cVar2 == '$')) {
    pcVar6 = pcVar1;
  }
LAB_0013617a:
  return pcVar6 == pcVar1;
}

Assistant:

inline bool is_identifier(const char *s, qsizetype len)
{
    if (len < 1)
        return false;
    return std::all_of(s, s + len, is_ident_char);
}